

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O3

REF_STATUS ref_matrix_inv_gen(REF_INT n,REF_DBL *orig,REF_DBL *inv)

{
  long lVar1;
  ulong uVar2;
  undefined8 uVar3;
  double dVar4;
  undefined1 auVar5 [16];
  REF_STATUS RVar6;
  void *__ptr;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  REF_DBL *pRVar12;
  ulong uVar13;
  ulong uVar14;
  void *pvVar15;
  long lVar16;
  void *pvVar17;
  REF_DBL *pRVar18;
  ulong uVar19;
  double dVar20;
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  double dVar25;
  ulong local_60;
  REF_DBL *local_58;
  void *local_50;
  
  __ptr = malloc((ulong)(uint)(n * n) << 3);
  if (__ptr == (void *)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_matrix.c",0x48b,
           "ref_matrix_inv_gen","malloc a of REF_DBL NULL");
    RVar6 = 2;
  }
  else {
    if (0 < n) {
      uVar8 = (ulong)(uint)n;
      uVar19 = 0;
      uVar9 = uVar8;
      do {
        memcpy((void *)((long)__ptr + uVar19 * 8),orig + uVar19,uVar8 * 8);
        uVar19 = (ulong)(uint)((int)uVar19 + n);
        uVar9 = uVar9 - 1;
      } while (uVar9 != 0);
      if (0 < n) {
        uVar19 = 0;
        uVar9 = uVar8;
        do {
          memset(inv + uVar19,0,uVar8 * 8);
          uVar19 = (ulong)(uint)((int)uVar19 + n);
          uVar9 = uVar9 - 1;
        } while (uVar9 != 0);
        if (0 < n) {
          iVar7 = 0;
          uVar9 = uVar8;
          do {
            inv[iVar7] = 1.0;
            iVar7 = iVar7 + n + 1;
            uVar9 = uVar9 - 1;
          } while (uVar9 != 0);
          if (0 < n) {
            lVar1 = uVar8 * 8;
            local_58 = inv + 1;
            uVar19 = 1;
            local_60 = 0;
            pvVar17 = __ptr;
            pRVar18 = inv;
            uVar9 = 0;
            local_50 = __ptr;
            do {
              local_50 = (void *)((long)local_50 + 8);
              uVar2 = uVar9 + 1;
              uVar14 = uVar9 & 0xffffffff;
              if (uVar2 < uVar8) {
                uVar13 = uVar19;
                uVar10 = uVar9 & 0xffffffff;
                do {
                  dVar20 = *(double *)((long)__ptr + uVar13 * 8 + local_60 * 8);
                  if (dVar20 <= -dVar20) {
                    dVar20 = -dVar20;
                  }
                  dVar21 = *(double *)((long)__ptr + (long)(int)uVar10 * 8 + uVar9 * uVar8 * 8);
                  if (dVar21 <= -dVar21) {
                    dVar21 = -dVar21;
                  }
                  uVar14 = uVar13 & 0xffffffff;
                  if (dVar20 <= dVar21) {
                    uVar14 = uVar10;
                  }
                  uVar13 = uVar13 + 1;
                  uVar10 = uVar14;
                } while (uVar8 != uVar13);
              }
              if (uVar9 != uVar14) {
                lVar11 = (long)(int)uVar14;
                lVar16 = 0;
                uVar14 = uVar8;
                do {
                  uVar3 = *(undefined8 *)((long)pvVar17 + lVar16);
                  *(undefined8 *)((long)pvVar17 + lVar16) =
                       *(undefined8 *)((long)__ptr + lVar16 + lVar11 * 8);
                  *(undefined8 *)((long)__ptr + lVar16 + lVar11 * 8) = uVar3;
                  uVar3 = *(undefined8 *)((long)pRVar18 + lVar16);
                  *(undefined8 *)((long)pRVar18 + lVar16) =
                       *(undefined8 *)((long)inv + lVar16 + lVar11 * 8);
                  *(undefined8 *)((long)inv + lVar16 + lVar11 * 8) = uVar3;
                  lVar16 = lVar16 + lVar1;
                  uVar14 = uVar14 - 1;
                } while (uVar14 != 0);
              }
              uVar14 = (ulong)(uint)((n + 1) * (int)uVar9);
              dVar20 = *(double *)((long)__ptr + uVar14 * 8);
              dVar21 = dVar20 * 1e+20;
              if (dVar21 <= -dVar21) {
                dVar21 = -dVar21;
              }
              lVar11 = 0;
              uVar13 = uVar8;
              do {
                dVar4 = *(double *)((long)pvVar17 + lVar11);
                dVar25 = dVar4;
                if (dVar4 <= -dVar4) {
                  dVar25 = -dVar4;
                }
                if (dVar21 <= dVar25) goto LAB_0016ed09;
                *(double *)((long)pvVar17 + lVar11) = dVar4 / dVar20;
                dVar4 = *(double *)((long)pRVar18 + lVar11);
                dVar25 = dVar4;
                if (dVar4 <= -dVar4) {
                  dVar25 = -dVar4;
                }
                if (dVar21 <= dVar25) goto LAB_0016ed09;
                *(double *)((long)pRVar18 + lVar11) = dVar4 / dVar20;
                lVar11 = lVar11 + lVar1;
                uVar13 = uVar13 - 1;
              } while (uVar13 != 0);
              if (uVar2 < uVar8) {
                pvVar15 = local_50;
                pRVar12 = local_58;
                uVar13 = uVar19;
                do {
                  dVar20 = *(double *)((long)__ptr + uVar14 * 8);
                  auVar22._0_8_ = dVar20 * 1e+20;
                  dVar21 = *(double *)((long)__ptr + uVar13 * 8 + (uVar9 * uVar8 & 0xffffffff) * 8);
                  auVar22._8_8_ = dVar21;
                  auVar23._8_8_ = -dVar21;
                  auVar23._0_8_ = -auVar22._0_8_;
                  auVar23 = maxpd(auVar22,auVar23);
                  if (auVar23._0_8_ <= auVar23._8_8_) goto LAB_0016ed09;
                  dVar20 = -(dVar21 / dVar20);
                  lVar11 = 0;
                  uVar10 = uVar8;
                  do {
                    *(double *)((long)pvVar15 + lVar11) =
                         *(double *)((long)pvVar17 + lVar11) * dVar20 +
                         *(double *)((long)pvVar15 + lVar11);
                    lVar11 = lVar11 + lVar1;
                    uVar10 = uVar10 - 1;
                  } while (uVar10 != 0);
                  lVar11 = 0;
                  uVar10 = uVar8;
                  do {
                    *(double *)((long)pRVar12 + lVar11) =
                         *(double *)((long)pRVar18 + lVar11) * dVar20 +
                         *(double *)((long)pRVar12 + lVar11);
                    lVar11 = lVar11 + lVar1;
                    uVar10 = uVar10 - 1;
                  } while (uVar10 != 0);
                  uVar13 = uVar13 + 1;
                  pvVar15 = (void *)((long)pvVar15 + 8);
                  pRVar12 = pRVar12 + 1;
                } while (uVar13 != uVar8);
              }
              if (uVar9 != 0) {
                uVar13 = 0;
                pRVar12 = inv;
                pvVar15 = __ptr;
                do {
                  dVar20 = *(double *)((long)__ptr + uVar14 * 8);
                  auVar24._0_8_ = dVar20 * 1e+20;
                  dVar21 = *(double *)((long)__ptr + uVar13 * 8 + (uVar9 * uVar8 & 0xffffffff) * 8);
                  auVar24._8_8_ = dVar21;
                  auVar5._8_8_ = -dVar21;
                  auVar5._0_8_ = -auVar24._0_8_;
                  auVar23 = maxpd(auVar24,auVar5);
                  if (auVar23._0_8_ <= auVar23._8_8_) {
LAB_0016ed09:
                    free(__ptr);
                    return 4;
                  }
                  dVar20 = -(dVar21 / dVar20);
                  lVar11 = 0;
                  uVar10 = uVar8;
                  do {
                    *(double *)((long)pvVar15 + lVar11) =
                         *(double *)((long)pvVar17 + lVar11) * dVar20 +
                         *(double *)((long)pvVar15 + lVar11);
                    lVar11 = lVar11 + lVar1;
                    uVar10 = uVar10 - 1;
                  } while (uVar10 != 0);
                  lVar11 = 0;
                  uVar10 = uVar8;
                  do {
                    *(double *)((long)pRVar12 + lVar11) =
                         *(double *)((long)pRVar18 + lVar11) * dVar20 +
                         *(double *)((long)pRVar12 + lVar11);
                    lVar11 = lVar11 + lVar1;
                    uVar10 = uVar10 - 1;
                  } while (uVar10 != 0);
                  uVar13 = uVar13 + 1;
                  pvVar15 = (void *)((long)pvVar15 + 8);
                  pRVar12 = pRVar12 + 1;
                } while (uVar13 != uVar9);
              }
              uVar19 = uVar19 + 1;
              local_60 = (ulong)(uint)((int)local_60 + n);
              pRVar18 = pRVar18 + 1;
              pvVar17 = (void *)((long)pvVar17 + 8);
              local_58 = local_58 + 1;
              uVar9 = uVar2;
            } while (uVar2 != uVar8);
          }
        }
      }
    }
    free(__ptr);
    RVar6 = 0;
  }
  return RVar6;
}

Assistant:

REF_FCN REF_STATUS ref_matrix_inv_gen(REF_INT n, REF_DBL *orig, REF_DBL *inv) {
  REF_INT i, j, k, best;
  REF_DBL *a;
  REF_DBL pivot, scale, temp;

  ref_malloc(a, n * n, REF_DBL);

  for (j = 0; j < n; j++)
    for (i = 0; i < n; i++) a[i + n * j] = orig[i + n * j];

  for (j = 0; j < n; j++)
    for (i = 0; i < n; i++) inv[i + n * j] = 0.0;
  for (i = 0; i < n; i++) inv[i + n * i] = 1.0;

  for (j = 0; j < n; j++) {
    /* find the best lower row */
    best = j;
    for (k = j + 1; k < n; k++)
      if (ABS(a[k + n * j]) > ABS(a[best + n * j])) best = k;

    if (best != j) /* if there is a better row then swap */
    {
      for (k = 0; k < n; k++) {
        temp = a[j + n * k];
        a[j + n * k] = a[best + n * k];
        a[best + n * k] = temp;
        temp = inv[j + n * k];
        inv[j + n * k] = inv[best + n * k];
        inv[best + n * k] = temp;
      }
    }

    /* scale row so a[j+n*j] is 1.0 */
    pivot = a[j + n * j];
    for (k = 0; k < n; k++) {
      if (!ref_math_divisible(a[j + k * n], pivot)) {
        ref_free(a);
        return REF_DIV_ZERO;
      }
      a[j + k * n] /= pivot;
      if (!ref_math_divisible(inv[j + k * n], pivot)) {
        ref_free(a);
        return REF_DIV_ZERO;
      }
      inv[j + k * n] /= pivot;
    }

    /* eliminate lower triangle */
    for (i = j + 1; i < n; i++) {
      if (!ref_math_divisible(a[i + j * n], a[j + j * n])) {
        ref_free(a);
        return REF_DIV_ZERO;
      }
      scale = a[i + j * n] / a[j + j * n];
      for (k = 0; k < n; k++) a[i + k * n] -= scale * a[j + k * n];
      for (k = 0; k < n; k++) inv[i + k * n] -= scale * inv[j + k * n];
    }

    /* eliminate upper triangle */
    for (i = 0; i < j; i++) {
      if (!ref_math_divisible(a[i + j * n], a[j + j * n])) {
        ref_free(a);
        return REF_DIV_ZERO;
      }
      scale = a[i + j * n] / a[j + j * n];
      for (k = 0; k < n; k++) a[i + k * n] -= scale * a[j + k * n];
      for (k = 0; k < n; k++) inv[i + k * n] -= scale * inv[j + k * n];
    }
  }

  ref_free(a);
  return REF_SUCCESS;
}